

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O3

void capnp::anon_unknown_0::expectSourceInfo
               (Reader sourceInfo,uint64_t expectedId,StringPtr expectedComment,
               initializer_list<const_kj::StringPtr> expectedMembers)

{
  int iVar1;
  ListElementCount LVar2;
  StringPtr *params_3;
  CapTableReader *__n;
  size_t __n_00;
  unsigned_long i;
  ulong uVar3;
  char *__s2;
  ulong uVar4;
  bool bVar5;
  ArrayPtr<const_char> AVar6;
  Reader RVar7;
  Reader members;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition_1;
  StringPtr expectedComment_local;
  uint64_t expectedId_local;
  Fault f;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  WirePointer *local_50;
  StructPointerCount local_44;
  int local_40;
  
  __n = (CapTableReader *)expectedComment.content.size_;
  __s2 = expectedComment.content.ptr;
  uVar4 = expectedMembers._M_len;
  params_3 = expectedMembers._M_array;
  if (sourceInfo._reader.dataSize < 0x40) {
    members.reader.segment = (SegmentReader *)0x0;
  }
  else {
    members.reader.segment = *sourceInfo._reader.data;
  }
  members.reader.capTable = (CapTableReader *)&expectedId_local;
  members.reader.ptr = " == ";
  members.reader.elementCount = 5;
  members.reader.step = 0;
  members.reader.structDataSize._0_1_ = members.reader.segment == (SegmentReader *)expectedId;
  expectedComment_local.content.ptr = __s2;
  expectedComment_local.content.size_ = (size_t)__n;
  expectedId_local = expectedId;
  if ((members.reader.segment != (SegmentReader *)expectedId) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[50],kj::_::DebugComparison<unsigned_long,unsigned_long&>&,capnp::schema::Node::SourceInfo::Reader&,unsigned_long&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,200,ERROR,
               "\"failed: expected \" \"sourceInfo.getId() == expectedId\", _kjCondition, sourceInfo, expectedId"
               ,(char (*) [50])"failed: expected sourceInfo.getId() == expectedId",
               (DebugComparison<unsigned_long,_unsigned_long_&> *)&members,&sourceInfo,
               (unsigned_long *)&expectedId_local);
  }
  bVar5 = sourceInfo._reader.pointerCount == 0;
  members.reader.ptr = (byte *)sourceInfo._reader.pointers;
  if (bVar5) {
    members.reader.ptr = (byte *)(WirePointer *)0x0;
  }
  LVar2 = 0x7fffffff;
  if (!bVar5) {
    LVar2 = sourceInfo._reader.nestingLimit;
  }
  members.reader.segment._0_4_ = 0;
  members.reader.segment._4_4_ = 0;
  members.reader.capTable._0_4_ = 0;
  members.reader.capTable._4_4_ = 0;
  if (!bVar5) {
    members.reader.segment._0_4_ = (uint)sourceInfo._reader.segment;
    members.reader.segment._4_4_ = sourceInfo._reader.segment._4_4_;
    members.reader.capTable._0_4_ = sourceInfo._reader.capTable._0_4_;
    members.reader.capTable._4_4_ = sourceInfo._reader.capTable._4_4_;
  }
  members.reader.elementCount = LVar2;
  AVar6 = (ArrayPtr<const_char>)
          capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&members,(void *)0x0,0);
  if ((CapTableReader *)AVar6.size_ == __n) {
    if (__n == (CapTableReader *)0x0) goto LAB_001d02e8;
    iVar1 = bcmp((SegmentReader *)AVar6.ptr,__s2,(size_t)__n);
    members.reader.capTable = __n;
    members.reader.segment = (SegmentReader *)AVar6.ptr;
    members.reader.ptr = (byte *)&expectedComment_local;
    members.reader._24_8_ = anon_var_dwarf_3c21f;
    members.reader.structDataSize = 5;
    members.reader.structPointerCount = 0;
    members.reader.elementSize = VOID;
    members.reader._39_1_ = 0;
    members.reader.nestingLimit._0_1_ = iVar1 == 0;
    if ((bool)(undefined1)members.reader.nestingLimit) goto LAB_001d02e8;
  }
  else {
    members.reader.nestingLimit._0_1_ = false;
    members.reader._0_16_ = AVar6;
  }
  members.reader.structDataSize = 5;
  members.reader.structPointerCount = 0;
  members.reader.elementSize = VOID;
  members.reader._39_1_ = 0;
  members.reader._24_8_ = " == ";
  members.reader.ptr = (byte *)&expectedComment_local;
  if (kj::_::Debug::minSeverity < 3) {
    members.reader.structDataSize = 5;
    members.reader.structPointerCount = 0;
    members.reader.elementSize = VOID;
    members.reader._39_1_ = 0;
    members.reader._24_8_ = anon_var_dwarf_3c21f;
    members.reader.ptr = (byte *)&expectedComment_local;
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<capnp::Text::Reader,kj::StringPtr&>&,capnp::schema::Node::SourceInfo::Reader&,kj::StringPtr&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0xc9,ERROR,
               "\"failed: expected \" \"sourceInfo.getDocComment() == expectedComment\", _kjCondition, sourceInfo, expectedComment"
               ,(char (*) [63])"failed: expected sourceInfo.getDocComment() == expectedComment",
               (DebugComparison<capnp::Text::Reader,_kj::StringPtr_&> *)&members,&sourceInfo,
               (StringPtr *)members.reader.ptr);
  }
LAB_001d02e8:
  _kjCondition_1.op.content.ptr = (char *)(sourceInfo._reader.pointers + 1);
  if (sourceInfo._reader.pointerCount < 2) {
    _kjCondition_1.op.content.ptr = (char *)(WirePointer *)0x0;
  }
  _kjCondition_1.left = (uint)sourceInfo._reader.segment;
  _kjCondition_1._4_4_ = sourceInfo._reader.segment._4_4_;
  _kjCondition_1.right._0_4_ = sourceInfo._reader.capTable._0_4_;
  _kjCondition_1.right._4_4_ = sourceInfo._reader.capTable._4_4_;
  iVar1 = sourceInfo._reader.nestingLimit;
  if (sourceInfo._reader.pointerCount < 2) {
    _kjCondition_1.left = 0;
    _kjCondition_1._4_4_ = 0;
    _kjCondition_1.right._0_4_ = 0;
    _kjCondition_1.right._4_4_ = 0;
    iVar1 = 0x7fffffff;
  }
  _kjCondition_1.op.content.size_ = CONCAT44(_kjCondition_1.op.content.size_._4_4_,iVar1);
  capnp::_::PointerReader::getList
            (&members.reader,(PointerReader *)&_kjCondition_1,INLINE_COMPOSITE,(word *)0x0);
  _kjCondition_1.left = members.reader.elementCount;
  _kjCondition_1.right = uVar4;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  bVar5 = (members.reader._24_8_ & 0xffffffff) == uVar4;
  _kjCondition_1.result = bVar5;
  if (!bVar5) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0xcc,FAILED,"members.size() == expectedMembers.size()","_kjCondition,",
               &_kjCondition_1);
    kj::_::Debug::Fault::fatal(&f);
  }
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      capnp::_::ListReader::getStructElement((StructReader *)&f,&members.reader,(ElementCount)uVar3)
      ;
      iVar1 = local_40;
      _kjCondition_1.op.content.ptr = (char *)local_50;
      if (local_44 == 0) {
        _kjCondition_1.op.content.ptr = (char *)0x0;
        iVar1 = 0x7fffffff;
      }
      _kjCondition_1.left = 0;
      _kjCondition_1._4_4_ = 0;
      _kjCondition_1.right._0_4_ = 0;
      _kjCondition_1.right._4_4_ = 0;
      if (local_44 != 0) {
        _kjCondition_1.left = (uint)f.exception;
        _kjCondition_1._4_4_ = f.exception._4_4_;
        _kjCondition_1.right._0_4_ = uStack_60;
        _kjCondition_1.right._4_4_ = uStack_5c;
      }
      _kjCondition_1.op.content.size_ = CONCAT44(_kjCondition_1.op.content.size_._4_4_,iVar1);
      RVar7 = capnp::_::PointerReader::getBlob<capnp::Text>
                        ((PointerReader *)&_kjCondition_1,(void *)0x0,0);
      __n_00 = RVar7.super_StringPtr.content.size_;
      if (__n_00 == (params_3->content).size_) {
        if (__n_00 != 0) {
          iVar1 = bcmp(RVar7.super_StringPtr.content.ptr,(params_3->content).ptr,__n_00);
          _kjCondition_1.op.content.size_ = (size_t)anon_var_dwarf_3c21f;
          _kjCondition_1.result = true;
          _kjCondition_1._33_7_ = 0;
          _kjCondition_1._0_16_ = RVar7;
          _kjCondition_1.op.content.ptr = (char *)params_3;
          if (iVar1 != 0) goto joined_r0x001d046d;
        }
      }
      else {
joined_r0x001d046d:
        _kjCondition_1.result = true;
        _kjCondition_1._33_7_ = 0;
        _kjCondition_1.op.content.size_ = 0x4d6514;
        _kjCondition_1._0_16_ = RVar7;
        _kjCondition_1.op.content.ptr = (char *)params_3;
        if (kj::_::Debug::minSeverity < 3) {
          _kjCondition_1.result = true;
          _kjCondition_1._33_7_ = 0;
          _kjCondition_1.op.content.size_ = (size_t)anon_var_dwarf_3c21f;
          capnp::_::ListReader::getStructElement
                    ((StructReader *)&f,&members.reader,(ElementCount)uVar3);
          kj::_::Debug::
          log<char_const(&)[74],kj::_::DebugComparison<capnp::Text::Reader,kj::StringPtr_const&>&,capnp::schema::Node::SourceInfo::Member::Reader,kj::StringPtr_const&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                     ,0xcf,ERROR,
                     "\"failed: expected \" \"members[i].getDocComment() == expectedMembers.begin()[i]\", _kjCondition, members[i], expectedMembers.begin()[i]"
                     ,(char (*) [74])
                      "failed: expected members[i].getDocComment() == expectedMembers.begin()[i]",
                     (DebugComparison<capnp::Text::Reader,_const_kj::StringPtr_&> *)&_kjCondition_1,
                     (Reader *)&f,params_3);
        }
      }
      uVar3 = uVar3 + 1;
      params_3 = params_3 + 1;
    } while (uVar4 != uVar3);
  }
  return;
}

Assistant:

void expectSourceInfo(schema::Node::SourceInfo::Reader sourceInfo,
                   uint64_t expectedId, kj::StringPtr expectedComment,
                   std::initializer_list<const kj::StringPtr> expectedMembers) {
  KJ_EXPECT(sourceInfo.getId() == expectedId, sourceInfo, expectedId);
  KJ_EXPECT(sourceInfo.getDocComment() == expectedComment, sourceInfo, expectedComment);

  auto members = sourceInfo.getMembers();
  KJ_ASSERT(members.size() == expectedMembers.size());
  for (auto i: kj::indices(expectedMembers)) {
    KJ_EXPECT(members[i].getDocComment() == expectedMembers.begin()[i],
              members[i], expectedMembers.begin()[i]);
  }
}